

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O2

void __thiscall siamese::Decoder::Decoder(Decoder *this)

{
  RecoveryMatrixState *this_00;
  CheckedRegionState *pCVar1;
  undefined1 auVar2 [32];
  
  pktalloc::Allocator::Allocator(&this->TheAllocator);
  DecoderStats::DecoderStats(&this->Stats);
  (this->CheckedRegion).RecoveryMatrix = (RecoveryMatrixState *)0x0;
  (this->CheckedRegion).ElementStart = 0;
  (this->CheckedRegion).FirstRecovery = (RecoveryPacket *)0x0;
  (this->CheckedRegion).LastRecovery = (RecoveryPacket *)0x0;
  *(undefined8 *)((long)&(this->CheckedRegion).LastRecovery + 5) = 0;
  *(undefined8 *)((long)&(this->CheckedRegion).RecoveryCount + 1) = 0;
  (this->RecoveryPackets).LastRecoveryBytes = 0;
  (this->RecoveryPackets).RecoveryPacketCount = 0;
  auVar2 = ZEXT432(0) << 0x40;
  (this->RecoveryPackets).TheAllocator = (Allocator *)auVar2._0_8_;
  (this->RecoveryPackets).CheckedRegion = (CheckedRegionState *)auVar2._8_8_;
  (this->RecoveryPackets).Head = (RecoveryPacket *)auVar2._16_8_;
  (this->RecoveryPackets).Tail = (RecoveryPacket *)auVar2._24_8_;
  DecoderPacketWindow::DecoderPacketWindow(&this->Window);
  this_00 = &this->RecoveryMatrix;
  RecoveryMatrixState::RecoveryMatrixState(this_00);
  (this->ProductSum).Data = (uint8_t *)0x0;
  (this->ProductSum).Bytes = 0;
  this->LatestColumn = 0;
  pCVar1 = &this->CheckedRegion;
  (this->RecoveryPackets).TheAllocator = &this->TheAllocator;
  (this->RecoveryPackets).CheckedRegion = pCVar1;
  (this->Window).TheAllocator = &this->TheAllocator;
  (this->Window).Stats = &this->Stats;
  (this->Window).CheckedRegion = pCVar1;
  (this->Window).RecoveryPackets = &this->RecoveryPackets;
  (this->Window).RecoveryMatrix = this_00;
  (this->RecoveryMatrix).TheAllocator = &this->TheAllocator;
  (this->RecoveryMatrix).Window = &this->Window;
  (this->RecoveryMatrix).CheckedRegion = pCVar1;
  (this->CheckedRegion).RecoveryMatrix = this_00;
  return;
}

Assistant:

Decoder::Decoder()
{
    RecoveryPackets.TheAllocator  = &TheAllocator;
    RecoveryPackets.CheckedRegion = &CheckedRegion;
    Window.TheAllocator           = &TheAllocator;
    Window.Stats                  = &Stats;
    Window.CheckedRegion          = &CheckedRegion;
    Window.RecoveryPackets        = &RecoveryPackets;
    Window.RecoveryMatrix         = &RecoveryMatrix;
    RecoveryMatrix.TheAllocator   = &TheAllocator;
    RecoveryMatrix.Window         = &Window;
    RecoveryMatrix.CheckedRegion  = &CheckedRegion;
    CheckedRegion.RecoveryMatrix  = &RecoveryMatrix;
}